

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_filter.cpp
# Opt level: O1

string * __thiscall
duckdb::OptionalFilter::ToString
          (string *__return_storage_ptr__,OptionalFilter *this,string *column_name)

{
  size_type *psVar1;
  undefined8 uVar2;
  pointer pTVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  local_40 = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"optional: ","");
  pTVar3 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
           operator->(&this->child_filter);
  (*pTVar3->_vptr_TableFilter[3])(&local_60,pTVar3,column_name);
  uVar5 = 0xf;
  if (local_40 != local_30) {
    uVar5 = local_30[0];
  }
  if (uVar5 < (ulong)(local_58 + local_38)) {
    uVar5 = 0xf;
    if (local_60 != local_50) {
      uVar5 = local_50[0];
    }
    if ((ulong)(local_58 + local_38) <= uVar5) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_40);
      goto LAB_00e1b97f;
    }
  }
  puVar4 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60);
LAB_00e1b97f:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string OptionalFilter::ToString(const string &column_name) const {
	return string("optional: ") + child_filter->ToString(column_name);
}